

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

string * __thiscall Operand::str_abi_cxx11_(string *__return_storage_ptr__,Operand *this)

{
  if (this->kind == 2) {
    std::operator+(__return_storage_ptr__,"#",&this->value);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->value);
  }
  return __return_storage_ptr__;
}

Assistant:

string str() const { return kind != OP_INTCONST ? value : "#" + value; }